

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::anon_unknown_15::FatalConditionHandler::handleSignal(int sig)

{
  size_t __s;
  allocator<char> local_49;
  string local_48;
  int *local_28;
  SignalDefs *def;
  size_t i;
  char *name;
  int sig_local;
  
  i = (size_t)anon_var_dwarf_27002;
  def = (SignalDefs *)0x0;
  do {
    if ((SignalDefs *)0x5 < def) {
LAB_00115854:
      name._4_4_ = sig;
      reset();
      __s = i;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,(char *)__s,&local_49);
      reportFatal(&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      raise(name._4_4_);
      return;
    }
    local_28 = (int *)((anonymous_namespace)::signalDefs + (long)def * 0x10);
    if (sig == *local_28) {
      i = *(size_t *)((anonymous_namespace)::signalDefs + (long)def * 0x10 + 8);
      goto LAB_00115854;
    }
    def = (SignalDefs *)((long)&def->id + 1);
  } while( true );
}

Assistant:

static void handleSignal(int sig) {
            const char* name = "<unknown signal>";
            for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                SignalDefs& def = signalDefs[i];
                if(sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise(sig);
        }